

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O2

string * __thiscall
bf_crc::bool_to_str_abi_cxx11_(string *__return_storage_ptr__,bf_crc *this,bool v)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "false";
  if ((int)this != 0) {
    __s = "true";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string bf_crc::bool_to_str(bool v) { 
  return v ? "true" : "false"; 
}